

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptionList.cpp
# Opt level: O0

void __thiscall curlpp::internal::OptionList::setOpt(OptionList *this,OptionBase *option)

{
  bool bVar1;
  map<CURLoption,_curlpp::OptionBase_*,_std::less<CURLoption>,_std::allocator<std::pair<const_CURLoption,_curlpp::OptionBase_*>_>_>
  *this_00;
  reference ppVar2;
  anon_enum_32 *__x;
  OptionBase *in_RSI;
  long in_RDI;
  iterator pos;
  map<CURLoption,_curlpp::OptionBase_*,_std::less<CURLoption>,_std::allocator<std::pair<const_CURLoption,_curlpp::OptionBase_*>_>_>
  *in_stack_ffffffffffffff78;
  map<CURLoption,_curlpp::OptionBase_*,_std::less<CURLoption>,_std::allocator<std::pair<const_CURLoption,_curlpp::OptionBase_*>_>_>
  *in_stack_ffffffffffffff80;
  iterator in_stack_ffffffffffffff88;
  _Self local_28;
  CURLoption local_1c;
  _Self local_18;
  OptionBase *local_10;
  
  this_00 = (map<CURLoption,_curlpp::OptionBase_*,_std::less<CURLoption>,_std::allocator<std::pair<const_CURLoption,_curlpp::OptionBase_*>_>_>
             *)(in_RDI + 8);
  local_10 = in_RSI;
  local_1c = OptionBase::getOption(in_RSI);
  local_18._M_node =
       (_Base_ptr)
       std::
       map<CURLoption,_curlpp::OptionBase_*,_std::less<CURLoption>,_std::allocator<std::pair<const_CURLoption,_curlpp::OptionBase_*>_>_>
       ::find(in_stack_ffffffffffffff78,(key_type *)0x14f427);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<CURLoption,_curlpp::OptionBase_*,_std::less<CURLoption>,_std::allocator<std::pair<const_CURLoption,_curlpp::OptionBase_*>_>_>
       ::end(in_stack_ffffffffffffff78);
  bVar1 = std::operator!=(&local_18,&local_28);
  if (bVar1) {
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_CURLoption,_curlpp::OptionBase_*>_>::operator*
                       ((_Rb_tree_iterator<std::pair<const_CURLoption,_curlpp::OptionBase_*>_> *)
                        0x14f45e);
    in_stack_ffffffffffffff88._M_node = (_Base_ptr)ppVar2->second;
    if (in_stack_ffffffffffffff88._M_node != (_Base_ptr)0x0) {
      (**(code **)(*(long *)in_stack_ffffffffffffff88._M_node + 8))();
    }
    std::
    map<CURLoption,curlpp::OptionBase*,std::less<CURLoption>,std::allocator<std::pair<CURLoption_const,curlpp::OptionBase*>>>
    ::erase_abi_cxx11_(in_stack_ffffffffffffff80,in_stack_ffffffffffffff88);
  }
  __x = (anon_enum_32 *)(in_RDI + 8);
  OptionBase::getOption(local_10);
  std::make_pair<CURLoption,curlpp::OptionBase*&>(__x,(OptionBase **)in_stack_ffffffffffffff78);
  std::
  map<CURLoption,curlpp::OptionBase*,std::less<CURLoption>,std::allocator<std::pair<CURLoption_const,curlpp::OptionBase*>>>
  ::insert<std::pair<CURLoption,curlpp::OptionBase*>>
            (this_00,(pair<CURLoption,_curlpp::OptionBase_*> *)in_stack_ffffffffffffff88._M_node);
  return;
}

Assistant:

void OptionList::setOpt(curlpp::OptionBase * option)
{
   mapType::iterator pos = mOptions.find(option->getOption());
   if(pos != mOptions.end())
   {
      delete (*pos).second;
      mOptions.erase(pos);	
   }
   mOptions.insert(std::make_pair(option->getOption(), option));
}